

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdFreeHandle(void *handle)

{
  void *in_stack_000000a8;
  CfdCapiManager *in_stack_000000b0;
  
  cfd::Initialize();
  cfd::capi::CfdCapiManager::FreeHandle(in_stack_000000b0,in_stack_000000a8);
  return 0;
}

Assistant:

int CfdFreeHandle(void* handle) {
  try {
    cfd::Initialize();
    cfd::capi::capi_instance.FreeHandle(handle);
    return kCfdSuccess;
  } catch (...) {
    return kCfdUnknownError;
  }
}